

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void __thiscall DConversationMenu::Drawer(DConversationMenu *this)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  PClassActor *type;
  AActor *pAVar13;
  FTexture *pFVar14;
  FString *pFVar15;
  uint *puVar16;
  uint local_124;
  uint local_dc;
  int yy;
  int color;
  char tbuf [16];
  uint i_2;
  int response;
  char local_88 [8];
  char goldstr [32];
  AInventory *coin;
  PClassActor *cointype;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_50;
  int i_1;
  int local_48;
  int local_44;
  int i;
  FStrifeDialogueNode *CurNode;
  player_t *cp;
  int local_28;
  int fontheight;
  int width;
  int linesize;
  int y;
  int x;
  char *speakerName;
  DConversationMenu *this_local;
  
  CurNode = (FStrifeDialogueNode *)(&players + (long)consoleplayer * 0x54);
  speakerName = (char *)this;
  if (this->mDialogueLines == (FBrokenLines *)0x0) {
    __assert_fail("mDialogueLines != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                  ,0x3d8,"virtual void DConversationMenu::Drawer()");
  }
  if (this->mCurNode != (FStrifeDialogueNode *)0x0) {
    _i = this->mCurNode;
    if (_i == (FStrifeDialogueNode *)0x0) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    }
    else {
      if (((ConversationPauseTic < gametic) && (!multiplayer)) && ((::level.flags2 & 0x100000) == 0)
         ) {
        menuactive = MENU_On;
      }
      bVar4 = FTextureID::isValid(&_i->Backdrop);
      pDVar2 = screen;
      if (bVar4) {
        local_44 = (_i->Backdrop).texnum;
        pFVar14 = FTextureManager::operator()(&TexMan,(FTextureID)local_44,false);
        DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar14,0.0,0.0,0x40001391,1,0);
      }
      iVar5 = DCanvas::GetWidth((DCanvas *)screen);
      linesize = (iVar5 << 4) / 0x140;
      iVar5 = DCanvas::GetHeight((DCanvas *)screen);
      width = (iVar5 << 4) / 200;
      fontheight = CleanYfac * 10;
      if (_i->SpeakerName == (char *)0x0) {
        pAVar13 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(CurNode + 8));
        _y = AActor::GetTag(pAVar13,"Person");
      }
      else {
        _y = _i->SpeakerName;
        if (*_y == '$') {
          _y = FStringTable::operator()(&GStrings,_y + 1);
        }
      }
      bVar4 = FTextureID::isValid(&_i->Backdrop);
      pDVar2 = screen;
      if (!bVar4) {
        local_48 = 0;
        while (-1 < this->mDialogueLines[local_48].Width) {
          local_48 = local_48 + 1;
        }
        PalEntry::PalEntry((PalEntry *)&i_1,0);
        iVar5 = DCanvas::GetWidth((DCanvas *)screen);
        iVar6 = DCanvas::GetHeight((DCanvas *)screen);
        iVar7 = DCanvas::GetWidth((DCanvas *)screen);
        iVar8 = DCanvas::GetWidth((DCanvas *)screen);
        if (_y == (char *)0x0) {
          local_dc = fontheight * local_48 + CleanYfac * 6;
        }
        else {
          local_dc = fontheight * local_48 + CleanYfac * 6 + (fontheight * 3) / 2;
        }
        (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (0x3ee66666,pDVar2,(ulong)(uint)i_1,(ulong)(uint)((iVar5 * 0xe) / 0x140),
                   (ulong)(uint)((iVar6 * 0xd) / 200),
                   (ulong)(uint)((iVar7 * 0x134) / 0x140 - (iVar8 * 0xe) / 0x140),(ulong)local_dc);
      }
      pDVar2 = screen;
      PalEntry::PalEntry((PalEntry *)&local_50.field_0,0);
      iVar5 = CleanXfac * -0x88;
      iVar6 = DCanvas::GetWidth((DCanvas *)screen);
      iVar7 = (this->mYpos + -0x66) * CleanYfac;
      iVar8 = DCanvas::GetHeight((DCanvas *)screen);
      uVar9 = CleanXfac * 0x110;
      uVar10 = TArray<FString,_FString>::Size(&this->mResponseLines);
      iVar11 = MIN<int>(uVar10 * OptionSettings.mLinespacing + 4,200 - this->mYpos);
      (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3ee66666,pDVar2,(ulong)local_50.d,(ulong)(uint)(iVar5 + iVar6 / 2),
                 (ulong)(uint)(iVar7 + iVar8 / 2),(ulong)uVar9,(ulong)(uint)(iVar11 * CleanYfac));
      if (_y != (char *)0x0) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,9,linesize,width,_y,0x40001393,1,0);
        width = (fontheight * 3) / 2 + width;
      }
      iVar5 = DCanvas::GetWidth((DCanvas *)screen);
      linesize = (iVar5 * 0x18) / 0x140;
      cointype._4_4_ = 0;
      while (iVar6 = linesize, iVar5 = width, pDVar2 = screen, pFVar1 = SmallFont,
            -1 < this->mDialogueLines[cointype._4_4_].Width) {
        pcVar12 = FString::operator_cast_to_char_(&this->mDialogueLines[cointype._4_4_].Text);
        DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,iVar6,iVar5,pcVar12,0x40001393,1,0);
        width = fontheight + width;
        cointype._4_4_ = cointype._4_4_ + 1;
      }
      if (((ShowGold & 1U) != 0) && (type = PClass::FindActor("Coin"), type != (PClassActor *)0x0))
      {
        pAVar13 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&CurNode[8].ItemCheck);
        goldstr._24_8_ = AActor::FindInventory(pAVar13,type,false);
        if ((AInventory *)goldstr._24_8_ == (AInventory *)0x0) {
          local_124 = 0;
        }
        else {
          local_124 = ((AInventory *)goldstr._24_8_)->Amount;
        }
        mysnprintf(local_88,0x20,"%d",(ulong)local_124);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,2,0x15,0xbf,local_88,0x40001391,
                          0x3fda000000000000,1,0x4000138d,0,0x4000138c,0);
        pDVar2 = screen;
        pAVar13 = GetDefaultByType(&type->super_PClass);
        pFVar14 = FTextureManager::operator()
                            (&TexMan,(FTextureID)
                                     *(int *)&pAVar13[1].super_DThinker.super_DObject.GCNext,false);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar2,pFVar14,3.0,190.0,0x40001391,0x3fda000000000000,1,0x4000138d,0,
                   0x4000138c,0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,2,0x14,0xbe,local_88,0x40001391,1,0);
        pDVar2 = screen;
        pAVar13 = GetDefaultByType(&type->super_PClass);
        pFVar14 = FTextureManager::operator()
                            (&TexMan,(FTextureID)
                                     *(int *)&pAVar13[1].super_DThinker.super_DObject.GCNext,false);
        DCanvas::DrawTexture((DCanvas *)pDVar2,pFVar14,2.0,189.0,0x40001391,1,0);
      }
      width = this->mYpos;
      cp._4_4_ = OptionSettings.mLinespacing;
      tbuf[0xc] = '\0';
      tbuf[0xd] = '\0';
      tbuf[0xe] = '\0';
      tbuf[0xf] = '\0';
      tbuf[8] = '\0';
      tbuf[9] = '\0';
      tbuf[10] = '\0';
      tbuf[0xb] = '\0';
      for (; uVar3 = tbuf._8_4_, uVar9 = TArray<FString,_FString>::Size(&this->mResponseLines),
          pFVar1 = SmallFont, (uint)uVar3 < uVar9; tbuf._8_4_ = tbuf._8_4_ + 1) {
        pFVar15 = TArray<FString,_FString>::operator[]
                            (&this->mResponseLines,(ulong)(uint)tbuf._8_4_);
        local_28 = FFont::StringWidth(pFVar1,pFVar15);
        iVar5 = width;
        pDVar2 = screen;
        pFVar1 = SmallFont;
        linesize = 0x40;
        pFVar15 = TArray<FString,_FString>::operator[]
                            (&this->mResponseLines,(ulong)(uint)tbuf._8_4_);
        pcVar12 = FString::operator_cast_to_char_(pFVar15);
        DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,3,0x40,iVar5,pcVar12,0x40001390,1,0);
        uVar3 = tbuf._8_4_;
        puVar16 = TArray<unsigned_int,_unsigned_int>::operator[]
                            (&this->mResponses,(long)(int)tbuf._12_4_);
        if (uVar3 == *puVar16) {
          tbuf._12_4_ = tbuf._12_4_ + 1;
          mysnprintf((char *)&yy,0x10,"%d.",(ulong)(uint)tbuf._12_4_);
          iVar5 = FFont::StringWidth(SmallFont,(char *)&yy);
          linesize = 0x32 - iVar5;
          DCanvas::DrawText((DCanvas *)screen,SmallFont,2,linesize,width,(char *)&yy,0x40001390,1,0)
          ;
          if (tbuf._12_4_ == mSelection + 1) {
            iVar5 = 2;
            if (DMenu::MenuTime % 8 < 4 || (DConversationMenu *)DMenu::CurrentMenu != this) {
              iVar5 = 6;
            }
            iVar6 = CleanXfac * -0x6b;
            iVar7 = DCanvas::GetWidth((DCanvas *)screen);
            linesize = iVar6 + iVar7 / 2;
            iVar6 = (width + cp._4_4_ / 2 + -0x69) * CleanYfac;
            iVar7 = DCanvas::GetHeight((DCanvas *)screen);
            DCanvas::DrawText((DCanvas *)screen,ConFont,iVar5,linesize,iVar6 + iVar7 / 2,"\r",
                              0x400013b8,CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
          }
        }
        width = cp._4_4_ + width;
      }
    }
    return;
  }
  __assert_fail("mCurNode != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                ,0x3d9,"virtual void DConversationMenu::Drawer()");
}

Assistant:

void Drawer()
	{
		const char *speakerName;
		int x, y, linesize;
		int width, fontheight;

		player_t *cp = &players[consoleplayer];

		assert (mDialogueLines != NULL);
		assert (mCurNode != NULL);

		FStrifeDialogueNode *CurNode = mCurNode;

		if (CurNode == NULL)
		{
			Close ();
			return;
		}

		// [CW] Freeze the game depending on MAPINFO options.
		if (ConversationPauseTic < gametic && !multiplayer && !(level.flags2 & LEVEL2_CONV_SINGLE_UNFREEZE))
		{
			menuactive = MENU_On;
		}

		if (CurNode->Backdrop.isValid())
		{
			screen->DrawTexture (TexMan(CurNode->Backdrop), 0, 0, DTA_320x200, true, TAG_DONE);
		}
		x = 16 * screen->GetWidth() / 320;
		y = 16 * screen->GetHeight() / 200;
		linesize = 10 * CleanYfac;

		// Who is talking to you?
		if (CurNode->SpeakerName != NULL)
		{
			speakerName = CurNode->SpeakerName;
			if (speakerName[0] == '$') speakerName = GStrings(speakerName+1);
		}
		else
		{
			speakerName = cp->ConversationNPC->GetTag("Person");
		}

		// Dim the screen behind the dialogue (but only if there is no backdrop).
		if (!CurNode->Backdrop.isValid())
		{
			int i;
			for (i = 0; mDialogueLines[i].Width >= 0; ++i)
			{ }
			screen->Dim (0, 0.45f, 14 * screen->GetWidth() / 320, 13 * screen->GetHeight() / 200,
				308 * screen->GetWidth() / 320 - 14 * screen->GetWidth () / 320,
				speakerName == NULL ? linesize * i + 6 * CleanYfac
				: linesize * i + 6 * CleanYfac + linesize * 3/2);
		}

		// Dim the screen behind the PC's choices.

		screen->Dim (0, 0.45f, (24-160) * CleanXfac + screen->GetWidth()/2,
			(mYpos - 2 - 100) * CleanYfac + screen->GetHeight()/2,
			272 * CleanXfac,
			MIN<int>(mResponseLines.Size() * OptionSettings.mLinespacing + 4, 200 - mYpos) * CleanYfac);

		if (speakerName != NULL)
		{
			screen->DrawText (SmallFont, CR_WHITE, x, y, speakerName,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize * 3 / 2;
		}
		x = 24 * screen->GetWidth() / 320;
		for (int i = 0; mDialogueLines[i].Width >= 0; ++i)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, mDialogueLines[i].Text,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize;
		}

		if (ShowGold)
		{
			auto cointype = PClass::FindActor("Coin");
			if (cointype)
			{
				AInventory *coin = cp->ConversationPC->FindInventory(cointype);
				char goldstr[32];

				mysnprintf(goldstr, countof(goldstr), "%d", coin != NULL ? coin->Amount : 0);
				screen->DrawText(SmallFont, CR_GRAY, 21, 191, goldstr, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					3, 190, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawText(SmallFont, CR_GRAY, 20, 190, goldstr, DTA_320x200, true, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					2, 189, DTA_320x200, true, TAG_DONE);
			}
		}

		y = mYpos;
		fontheight = OptionSettings.mLinespacing;

		int response = 0;
		for (unsigned i = 0; i < mResponseLines.Size(); i++, y += fontheight)
		{
			width = SmallFont->StringWidth(mResponseLines[i]);
			x = 64;

			screen->DrawText (SmallFont, CR_GREEN, x, y, mResponseLines[i], DTA_Clean, true, TAG_DONE);

			if (i == mResponses[response])
			{
				char tbuf[16];

				response++;
				mysnprintf (tbuf, countof(tbuf), "%d.", response);
				x = 50 - SmallFont->StringWidth (tbuf);
				screen->DrawText (SmallFont, CR_GREY, x, y, tbuf, DTA_Clean, true, TAG_DONE);

				if (response == mSelection+1)
				{
					int color = ((DMenu::MenuTime%8) < 4) || DMenu::CurrentMenu != this ? CR_RED:CR_GREY;

					x = (50 + 3 - 160) * CleanXfac + screen->GetWidth() / 2;
					int yy = (y + fontheight/2 - 5 - 100) * CleanYfac + screen->GetHeight() / 2;
					screen->DrawText (ConFont, color, x, yy, "\xd",
						DTA_CellX, 8 * CleanXfac,
						DTA_CellY, 8 * CleanYfac,
						TAG_DONE);
				}
			}
		}
	}